

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergePartialFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg)

{
  long lVar1;
  long *in_RSI;
  ParseContext ctx;
  char *ptr;
  ZeroCopyInputStream **in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar2;
  undefined1 local_88 [3];
  undefined1 in_stack_ffffffffffffff7b;
  int in_stack_ffffffffffffff7c;
  ParseContext *in_stack_ffffffffffffff80;
  undefined8 local_18;
  
  io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(bool)in_stack_ffffffffffffff7b,
             (char **)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  lVar1 = (**(code **)(*in_RSI + 0x68))(in_RSI,local_18,local_88);
  bVar2 = false;
  if (lVar1 != 0) {
    bVar2 = EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)local_88);
  }
  return bVar2;
}

Assistant:

bool MergePartialFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  return ptr && ctx.EndedAtEndOfStream();
}